

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trapezoidal_decomposition.cc
# Opt level: O0

void __thiscall
PolygonTriangulation::add_segment_to_query_structure
          (PolygonTriangulation *this,uint32_t segment_index)

{
  uint32_t local_28;
  uint32_t local_24;
  uint32_t max_y_index;
  uint32_t min_y_index;
  value_type *segment;
  PolygonTriangulation *pPStack_10;
  uint32_t segment_index_local;
  PolygonTriangulation *this_local;
  
  segment._4_4_ = segment_index;
  pPStack_10 = this;
  _max_y_index = std::vector<segment_t,_std::allocator<segment_t>_>::operator[]
                           (&this->segments_,(ulong)segment_index);
  get_max_min_y_indices(this,_max_y_index,&local_28,&local_24);
  add_endpoint_to_query_structure(this,local_28);
  add_endpoint_to_query_structure(this,local_24);
  thread_endpoints(this,segment._4_4_,local_28,local_24);
  return;
}

Assistant:

void PolygonTriangulation::add_segment_to_query_structure(const uint32_t segment_index)
{
  const auto &segment = segments_[segment_index];

  uint32_t min_y_index, max_y_index;
  get_max_min_y_indices(segment, max_y_index, min_y_index);

  add_endpoint_to_query_structure(max_y_index);
  add_endpoint_to_query_structure(min_y_index);
  thread_endpoints(segment_index, max_y_index, min_y_index);
}